

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O3

void duckdb_brotli::BrotliInitBlockSplit(BlockSplit *self)

{
  self->types_alloc_size = 0;
  self->lengths_alloc_size = 0;
  self->types = (uint8_t *)0x0;
  self->lengths = (uint32_t *)0x0;
  self->num_types = 0;
  self->num_blocks = 0;
  return;
}

Assistant:

void duckdb_brotli::BrotliInitBlockSplit(BlockSplit* self) {
  self->num_types = 0;
  self->num_blocks = 0;
  self->types = 0;
  self->lengths = 0;
  self->types_alloc_size = 0;
  self->lengths_alloc_size = 0;
}